

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PushConstantComputeTestInstance *this)

{
  VkSemaphore *pVVar1;
  VkResult VVar2;
  int iVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  Handle<(vk::HandleType)6> *pHVar6;
  reference a;
  Allocation *this_00;
  void *b;
  Move<vk::Handle<(vk::HandleType)6>_> *this_01;
  allocator<char> local_109;
  string local_108;
  undefined4 local_e8;
  allocator<char> local_e1;
  string local_e0;
  allocator<tcu::Vector<float,_4>_> local_a9;
  Vector<float,_4> local_a8;
  undefined1 local_98 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> expectValue;
  undefined8 uStack_78;
  VkSubmitInfo submitInfo;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  PushConstantComputeTestInstance *this_local;
  
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  submitInfo.pSignalSemaphores =
       (VkSemaphore *)Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_78 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  this_01 = &this->m_fence;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&this_01->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar4->_vptr_DeviceInterface[0x14])(pDVar4,pVVar5,1,pHVar6);
  ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60c);
  pVVar1 = submitInfo.pSignalSemaphores;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     (&this_01->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  expectValue.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar6->m_internal;
  VVar2 = (*pDVar4->_vptr_DeviceInterface[2])
                    (pDVar4,pVVar1,1,&uStack_78,
                     expectValue.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60d);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&this_01->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar4->_vptr_DeviceInterface[0x16])(pDVar4,pVVar5,1,pHVar6,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60e);
  tcu::Vector<float,_4>::Vector(&local_a8,1.0,0.0,0.0,1.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_a9);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_98,8,
             &local_a8,&local_a9);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_a9);
  a = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_98,
                 0);
  this_00 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_outBufferAlloc).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  b = ::vk::Allocation::getHostPtr(this_00);
  iVar3 = deMemCmp(a,b,0x80);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"result image matches with reference",&local_109);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Image mismatch",&local_e1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  local_e8 = 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus PushConstantComputeTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	// verify result
	std::vector<tcu::Vec4>	expectValue(8, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	if (deMemCmp((void*)(&expectValue[0]), m_outBufferAlloc->getHostPtr(), (size_t)(sizeof(tcu::Vec4) * 8)))
	{
		return tcu::TestStatus::fail("Image mismatch");
	}
	return tcu::TestStatus::pass("result image matches with reference");
}